

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O2

int __thiscall
baryonyx::itm::compute_order::
infeasibility_local_compute_violated_constraints<baryonyx::itm::solver_inequalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>const,baryonyx::bit_array>
          (compute_order *this,
          solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>
          *solver,bit_array *x)

{
  pointer ppVar1;
  bound_factor *pbVar2;
  undefined8 uVar3;
  _Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false> _Var4;
  int iVar5;
  int iVar6;
  uint uVar7;
  pair<int,_int> pVar8;
  int iVar9;
  undefined1 local_70 [16];
  _Head_base<0UL,_int_*,_false> local_60;
  solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>
  *local_58;
  __uniq_ptr_impl<baryonyx::sparse_matrix<int>::row_value,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
  local_50;
  sparse_matrix<int> *local_48;
  __uniq_ptr_impl<baryonyx::sparse_matrix<int>::col_value,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
  local_40;
  _Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false> local_38;
  
  ppVar1 = (this->m_order).
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_order).super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVar1) {
    (this->m_order).super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppVar1;
  }
  local_60._M_head_impl = (int *)&this->m_order;
  local_40._M_t.
  super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
  .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false>._M_head_impl._4_4_ = 0;
  local_40._M_t.
  super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
  .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false>._M_head_impl._0_4_ =
       solver->m;
  local_48 = &solver->ap;
  local_38._M_head_impl = (col_value *)0x0;
  local_58 = solver;
  local_50._M_t.
  super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
  .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>._M_head_impl =
       (tuple<baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
        )(tuple<baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
          )this;
  while ((tuple<baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
          )local_38._M_head_impl !=
         (_Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
          )local_40._M_t.
           super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
           .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false>._M_head_impl) {
    sparse_matrix<int>::row((sparse_matrix<int> *)local_70,(int)local_48);
    uVar3 = local_70._0_8_;
    iVar9 = 0;
    for (pVar8 = (pair<int,_int>)local_70._8_8_; _Var4._M_head_impl = local_38._M_head_impl,
        pVar8 != (pair<int,_int>)uVar3; pVar8 = (pair<int,_int>)((long)pVar8 + 8)) {
      iVar5 = value_bit_array<-1,_1>::get(&solver->A,*(int *)pVar8);
      iVar6 = bit_array::operator[](x,*(int *)((long)pVar8 + 4));
      iVar9 = iVar9 + iVar6 * iVar5;
    }
    pbVar2 = (local_58->b)._M_t.
             super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::bound_factor,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::bound_factor[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::bound_factor[]>_>
             .
             super__Head_base<0UL,_baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::bound_factor_*,_false>
             ._M_head_impl;
    iVar5 = pbVar2[(long)local_38._M_head_impl].min;
    uVar7 = iVar5 - iVar9;
    if ((uVar7 != 0 && iVar9 <= iVar5) ||
       (iVar5 = pbVar2[(long)local_38._M_head_impl].max, uVar7 = iVar9 - iVar5,
       uVar7 != 0 && iVar5 <= iVar9)) {
      local_70._0_8_ = (ulong)uVar7 << 0x20 | (ulong)local_38._M_head_impl;
      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
      emplace_back<std::pair<int,int>>
                ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                 local_60._M_head_impl,(pair<int,_int> *)local_70);
    }
    local_38._M_head_impl = (col_value *)((long)&(_Var4._M_head_impl)->value + 1);
  }
  return (int)((ulong)((long)*(pointer *)
                              ((long)local_50._M_t.
                                     super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
                                     .
                                     super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>
                                     ._M_head_impl + 0x20) -
                      (long)(((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                             ((long)local_50._M_t.
                                    super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
                                    .
                                    super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>
                                    ._M_head_impl + 0x18))->
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            )._M_impl.super__Vector_impl_data._M_start) >> 3);
}

Assistant:

int infeasibility_local_compute_violated_constraints(Solver& solver,
                                                         const Xtype& x)
    {
        m_order.clear();

        for (int k = 0, e = solver.m; k != e; ++k) {
            sparse_matrix<int>::const_row_iterator it, et;
            std::tie(it, et) = solver.ap.row(k);
            int v = 0;

            for (; it != et; ++it)
                v += solver.factor(it->value) * x[it->column];

            if (solver.bound_min(k) > v)
                m_order.push_back(std::make_pair(k, solver.bound_min(k) - v));
            else if (solver.bound_max(k) < v)
                m_order.push_back(std::make_pair(k, v - solver.bound_max(k)));
        }

        return length(m_order);
    }